

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_truncated.c
# Opt level: O0

void test_read_truncated(void)

{
  int iVar1;
  la_ssize_t lVar2;
  size_t local_28;
  size_t used;
  archive *paStack_18;
  uint i;
  archive *a;
  archive_entry *ae;
  
  paStack_18 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                   ,L'&',(uint)(paStack_18 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paStack_18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                      paStack_18);
  iVar1 = archive_write_add_filter_none(paStack_18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paStack_18
                     );
  iVar1 = archive_write_open_memory(paStack_18,buff,1000000,&local_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paStack_18);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                   ,L'.',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,"file");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  fill_with_pseudorandom_data(buff2,100000);
  archive_entry_set_size((archive_entry *)a,100000);
  iVar1 = archive_write_header(paStack_18,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paStack_18);
  archive_entry_free((archive_entry *)a);
  lVar2 = archive_write_data(paStack_18,buff2,100000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'5',100000,"sizeof(buff2)",lVar2,
                      "archive_write_data(a, buff2, sizeof(buff2))",paStack_18);
  iVar1 = archive_write_close(paStack_18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paStack_18);
  iVar1 = archive_write_free(paStack_18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  for (used._4_4_ = 1; (ulong)used._4_4_ < local_28 + 100; used._4_4_ = used._4_4_ + 100) {
    paStack_18 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                     ,L'>',(uint)(paStack_18 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paStack_18);
    iVar1 = archive_read_support_filter_all(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paStack_18);
    if (used._4_4_ < 0x200) {
      iVar1 = archive_read_open_memory(paStack_18,buff,(ulong)used._4_4_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'B',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                          "archive_read_open_memory(a, buff, i)",paStack_18);
    }
    else {
      iVar1 = archive_read_open_memory(paStack_18,buff,(ulong)used._4_4_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, i)",
                          paStack_18);
      iVar1 = archive_read_next_header(paStack_18,(archive_entry **)&a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'G',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paStack_18);
      if (used._4_4_ < 0x188a0) {
        lVar2 = archive_read_data(paStack_18,buff2,100000);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                            ,L'J',-0x1e,"ARCHIVE_FATAL",lVar2,
                            "archive_read_data(a, buff2, sizeof(buff2))",paStack_18);
      }
      else {
        lVar2 = archive_read_data(paStack_18,buff2,100000);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                            ,L'M',100000,"sizeof(buff2)",lVar2,
                            "archive_read_data(a, buff2, sizeof(buff2))",paStack_18);
        if (used._4_4_ < 0x18c00) {
          iVar1 = archive_read_next_header(paStack_18,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                              ,L'W',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                              "archive_read_next_header(a, &ae)",paStack_18);
        }
        else {
          iVar1 = archive_read_next_header(paStack_18,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                              ,L'Y',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                              paStack_18);
        }
      }
    }
    iVar1 = archive_read_close(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paStack_18);
    iVar1 = archive_read_free(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L']',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  for (used._4_4_ = 1; (ulong)used._4_4_ < local_28 + 100; used._4_4_ = used._4_4_ + 100) {
    paStack_18 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                     ,L'd',(uint)(paStack_18 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paStack_18);
    iVar1 = archive_read_support_filter_all(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paStack_18);
    if (used._4_4_ < 0x200) {
      iVar1 = archive_read_open_memory(paStack_18,buff,(ulong)used._4_4_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'h',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                          "archive_read_open_memory(a, buff, i)",paStack_18);
    }
    else {
      iVar1 = archive_read_open_memory(paStack_18,buff,(ulong)used._4_4_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, i)",
                          paStack_18);
      iVar1 = archive_read_next_header(paStack_18,(archive_entry **)&a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                          ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paStack_18);
      if (used._4_4_ < 0x18a00) {
        iVar1 = archive_read_data_skip(paStack_18);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                            ,L'p',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_read_data_skip(a)",
                            paStack_18);
      }
      else {
        iVar1 = archive_read_data_skip(paStack_18);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                            ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_data_skip(a)",paStack_18)
        ;
        if (used._4_4_ < 0x18c00) {
          iVar1 = archive_read_next_header(paStack_18,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                              ,L'}',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                              "archive_read_next_header(a, &ae)",paStack_18);
        }
        else {
          iVar1 = archive_read_next_header(paStack_18,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                              ,L'\x7f',1,"ARCHIVE_EOF",(long)iVar1,
                              "archive_read_next_header(a, &ae)",paStack_18);
        }
      }
    }
    iVar1 = archive_read_close(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paStack_18);
    iVar1 = archive_read_free(paStack_18);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated.c"
                        ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_truncated)
{
	struct archive_entry *ae;
	struct archive *a;
	unsigned int i;
	size_t used;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	fill_with_pseudorandom_data(buff2, sizeof(buff2));
	archive_entry_set_size(ae, sizeof(buff2));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, sizeof(buff2), archive_write_data(a, buff2, sizeof(buff2)));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Now, read back a truncated version of the archive and
	 * verify that we get an appropriate error. */
	for (i = 1; i < used + 100; i += 100) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		if (i < 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_open_memory(a, buff, i));
			goto wrap_up;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, i));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

		if (i < 512 + sizeof(buff2)) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data(a, buff2, sizeof(buff2)));
			goto wrap_up;
		} else {
			assertEqualIntA(a, sizeof(buff2), archive_read_data(a, buff2, sizeof(buff2)));
		}

		/* Verify the end of the archive. */
		/* Archive must be long enough to capture a 512-byte
		 * block of zeroes after the entry.  (POSIX requires a
		 * second block of zeros to be written but libarchive
		 * does not return an error if it can't consume
		 * it.) */
		if (i < 512 + 512*((sizeof(buff2) + 511)/512) + 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
		} else {
			assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
		}
	wrap_up:
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}



	/* Same as above, except skip the body instead of reading it. */
	for (i = 1; i < used + 100; i += 100) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		if (i < 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_open_memory(a, buff, i));
			goto wrap_up2;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, i));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

		if (i < 512 + 512*((sizeof(buff2)+511)/512)) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data_skip(a));
			goto wrap_up2;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		}

		/* Verify the end of the archive. */
		/* Archive must be long enough to capture a 512-byte
		 * block of zeroes after the entry.  (POSIX requires a
		 * second block of zeros to be written but libarchive
		 * does not return an error if it can't consume
		 * it.) */
		if (i < 512 + 512*((sizeof(buff2) + 511)/512) + 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
		} else {
			assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
		}
	wrap_up2:
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
}